

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

void __thiscall Server::Start(Server *this)

{
  int iVar1;
  ostream *poVar2;
  char *__nptr;
  size_type sVar3;
  NetworkNode local_50;
  int local_3c;
  sockaddr *psStack_38;
  int descriptor;
  sockaddr *addr;
  socklen_t addrlenl;
  int on;
  sockaddr_in serv_addr;
  int portno;
  int sockfd;
  Server *this_local;
  
  serv_addr.sin_zero._4_4_ = socket(2,1,0);
  addr._4_4_ = 1;
  setsockopt(serv_addr.sin_zero._4_4_,1,2,(void *)((long)&addr + 4),4);
  setsockopt(serv_addr.sin_zero._4_4_,6,1,(void *)((long)&addr + 4),4);
  addr._4_4_ = 0xc00000;
  setsockopt(serv_addr.sin_zero._4_4_,1,7,(void *)((long)&addr + 4),4);
  setsockopt(serv_addr.sin_zero._4_4_,1,8,(void *)((long)&addr + 4),4);
  if ((int)serv_addr.sin_zero._4_4_ < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR opening socket");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bzero(&addrlenl,0x10);
  __nptr = (char *)std::__cxx11::string::c_str();
  serv_addr.sin_zero._0_4_ = atoi(__nptr);
  addrlenl._0_2_ = 2;
  on = 0;
  addrlenl._2_2_ = htons((uint16_t)serv_addr.sin_zero._0_4_);
  iVar1 = bind(serv_addr.sin_zero._4_4_,(sockaddr *)&addrlenl,0x10);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR on binding");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  listen(serv_addr.sin_zero._4_4_,0x14);
  psStack_38 = (sockaddr *)malloc((ulong)(uint)addr);
  do {
    poVar2 = std::operator<<((ostream *)&std::cerr,"waiting for next client");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_3c = accept(serv_addr.sin_zero._4_4_,psStack_38,(socklen_t *)&addr);
    if (local_3c < 0) {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"ERROR in ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MarcinWylot[P]tripleprov_demo/src/Server.cpp"
                              );
      poVar2 = std::operator<<(poVar2," at line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x46);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    NetworkNode::NetworkNode(&local_50,local_3c);
    std::vector<NetworkNode,_std::allocator<NetworkNode>_>::push_back(&this->nodes,&local_50);
    NetworkNode::~NetworkNode(&local_50);
    poVar2 = std::operator<<((ostream *)&std::cout,"connected: ");
    sVar3 = std::vector<NetworkNode,_std::allocator<NetworkNode>_>::size(&this->nodes);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    sVar3 = std::vector<NetworkNode,_std::allocator<NetworkNode>_>::size(&this->nodes);
  } while (sVar3 != diplo::nbOfClients);
  poVar2 = std::operator<<((ostream *)&std::cerr,"All clients connected");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Server::Start() {
	int sockfd, portno;
	struct sockaddr_in serv_addr;

	sockfd = socket(AF_INET, SOCK_STREAM, 0);
	int on = 1;
	setsockopt(sockfd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on));
	setsockopt(sockfd, IPPROTO_TCP, TCP_NODELAY, (char *) &on, sizeof(on));

	on = 12582912;
	setsockopt(sockfd, SOL_SOCKET, SO_SNDBUF, (char *) &on, sizeof(on));
	setsockopt(sockfd, SOL_SOCKET, SO_RCVBUF, (char *) &on, sizeof(on));

	if (sockfd < 0)
		cerr << "ERROR opening socket" << endl;
	bzero((char *) &serv_addr, sizeof(serv_addr));
	portno = atoi(diplo::server_port.c_str());
	serv_addr.sin_family = AF_INET;
	serv_addr.sin_addr.s_addr = INADDR_ANY;
	serv_addr.sin_port = htons(portno);
	if (bind(sockfd, (struct sockaddr *) &serv_addr, sizeof(serv_addr)) < 0)
		cerr << "ERROR on binding" << endl;
	listen(sockfd, 20);

	socklen_t addrlenl;
	struct sockaddr *addr = (struct sockaddr *) malloc(addrlenl);

	while (1) {
		cerr << "waiting for next client" << endl;
		int descriptor = accept(sockfd, addr, &addrlenl);
		if (descriptor < 0) {
			ERROR_OUT
			exit(1);
		}

		nodes.push_back(NetworkNode(descriptor));
		cout << "connected: " << nodes.size() << endl;
		if (nodes.size() == diplo::nbOfClients) {
			cerr << "All clients connected" << endl;
			return; //FIXME, this is not right way
		}
	}

}